

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

int __thiscall GameBoard::transfer(GameBoard *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  uVar4 = this->transCount[0];
  iVar1 = this->transCount[1];
  if (uVar4 != 0 || iVar1 != 0) {
    if (uVar4 == 0) {
      uVar8 = (ulong)(0 < iVar1);
      uVar7 = (ulong)(iVar1 < 1);
      uVar4 = this->transCount[uVar8];
    }
    else {
      if (iVar1 != 0) {
        iVar2 = this->maxHeight[0];
        this->maxHeight[0] = iVar2 + iVar1;
        iVar12 = this->maxHeight[1] + uVar4;
        this->maxHeight[1] = iVar12;
        if (0x14 < iVar2 + iVar1) {
          return 0;
        }
        if (iVar12 < 0x15) {
          lVar10 = (long)iVar12;
          piVar3 = this->gridInfo[1][lVar10] + 1;
          while ((int)uVar4 < lVar10) {
            for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
              piVar3[lVar6] = piVar3[lVar6 + (long)this->transCount[0] * -0xc];
            }
            lVar10 = lVar10 + -1;
            piVar3 = piVar3 + -0xc;
            uVar4 = this->transCount[0];
          }
          uVar7 = (ulong)uVar4;
          piVar3 = this->trans[-1][uVar7 + 3] + 1;
          while (0 < (int)uVar7) {
            uVar7 = uVar7 - 1;
            for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
              piVar3[lVar10 + -0xfc] = piVar3[lVar10];
            }
            piVar3 = piVar3 + -0xc;
          }
          lVar6 = (long)(this->gridInfo + -1) + 0x40c + (long)iVar1 * 0x30 + (long)iVar2 * 0x30;
          for (lVar10 = (long)iVar1 + (long)iVar2; this->transCount[1] < lVar10;
              lVar10 = lVar10 + -1) {
            for (lVar11 = 6; lVar11 != 0x10; lVar11 = lVar11 + 1) {
              *(undefined4 *)(lVar6 + lVar11 * 4) =
                   *(undefined4 *)((long)this->transCount[1] * -0x30 + lVar6 + lVar11 * 4);
            }
            lVar6 = lVar6 + -0x30;
          }
          uVar7 = (ulong)(uint)this->transCount[1];
          piVar3 = this->trans[0][uVar7 + 3] + 1;
          while (0 < (int)uVar7) {
            uVar7 = uVar7 - 1;
            for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
              piVar3[lVar10 + -0x234] = piVar3[lVar10];
            }
            piVar3 = piVar3 + -0xc;
          }
          return -1;
        }
        return 1;
      }
      uVar7 = 1;
      uVar8 = 0;
    }
    iVar1 = this->maxHeight[uVar7];
    this->maxHeight[uVar7] = iVar1 + uVar4;
    if (0x14 < (int)(iVar1 + uVar4)) {
      return (int)uVar7;
    }
    lVar10 = (long)iVar1 + (long)(int)uVar4;
    piVar3 = this->gridInfo[uVar7 - 1][(long)(int)uVar4 + (long)iVar1 + 0x15] + 7;
    while ((int)uVar4 < lVar10) {
      for (lVar6 = 6; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        piVar3[lVar6] = piVar3[lVar6 + (long)this->transCount[uVar8] * -0xc];
      }
      lVar10 = lVar10 + -1;
      piVar3 = piVar3 + -0xc;
      uVar4 = this->transCount[uVar8];
    }
    uVar5 = (ulong)uVar4;
    piVar9 = this->trans[uVar8 - 1][uVar5 + 3] + 1;
    piVar3 = this->gridInfo[uVar7][uVar5] + 1;
    while (0 < (int)uVar5) {
      uVar5 = uVar5 - 1;
      for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
        piVar3[lVar10] = piVar9[lVar10];
      }
      piVar9 = piVar9 + -0xc;
      piVar3 = piVar3 + -0xc;
    }
  }
  return -1;
}

Assistant:

int GameBoard::transfer()
{
    int color1 = 0, color2 = 1;
    if (transCount[color1] == 0 && transCount[color2] == 0)
        return -1;
    if (transCount[color1] == 0 || transCount[color2] == 0) {
        if (transCount[color1] == 0 && transCount[color2] > 0)
            swap(color1, color2);
        int h2;
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];
        if (h2 > MAPHEIGHT)
            return color2;
        int i, j;

        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];
        return -1;
    }
    else {
        int h1, h2;
        maxHeight[color1] = h1 = maxHeight[color1] + transCount[color2];//从color1处移动count1去color2
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];

        if (h1 > MAPHEIGHT)
            return color1;
        if (h2 > MAPHEIGHT)
            return color2;

        int i, j;
        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];

        for (i = h1; i > transCount[color2]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = gridInfo[color1][i - transCount[color2]][j];

        for (i = transCount[color2]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = trans[color2][i - 1][j];

        return -1;
    }
}